

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O1

void __thiscall EventQueue::RemoveAgentsByReceiver(EventQueue *this,void *receiver)

{
  int iVar1;
  undefined4 extraout_var;
  iterator i;
  AutoLock _auto_lock_;
  Node *local_48;
  iterator local_40;
  AutoLock local_38;
  
  AutoLock::AutoLock(&local_38,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventQueue.cpp"
                     ,0xa1);
  local_48 = ((this->mQueue).mHead)->next;
  if (local_48 != (this->mQueue).mTail) {
    do {
      if (*(int *)&(local_48->val->super_RefCount).field_0xc == -5) {
        iVar1 = (*(local_48->val->super_RefCount)._vptr_RefCount[4])();
        if ((void *)CONCAT44(extraout_var,iVar1) == receiver) {
          RefCount::Release(&local_48->val->super_RefCount);
          JetHead::list<Event_*>::iterator::erase(&local_40);
          local_48 = local_40.mNode;
          if (local_40.mNode != (Node *)0x0) {
            local_48 = (local_40.mNode)->prev;
          }
        }
      }
      if (local_48 != (Node *)0x0) {
        local_48 = local_48->next;
      }
    } while (local_48 != (this->mQueue).mTail);
  }
  AutoLock::~AutoLock(&local_38);
  return;
}

Assistant:

void EventQueue::RemoveAgentsByReceiver( void* receiver )
{
	DebugAutoLock( mLock );

	for (JetHead::list<Event*>::iterator i = mQueue.begin(); i != mQueue.end(); ++i)
	{
		if ((*i)->getEventId() == Event::kAgentEventId)
		{
			EventAgent* agent = static_cast<EventAgent*>(*i);
			if (agent->getDeliveryTarget() == receiver)
			{
				(*i)->Release();
				i = i.erase();
				--i;
			}
		}
	}
}